

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void FASTCOVER_tryParameters(void *opaque)

{
  byte bVar1;
  FASTCOVER_ctx_t *ctx;
  ZDICT_cover_params_t parameters_00;
  ZDICT_cover_params_t params;
  COVER_dictSelection_t selection;
  U16 *__ptr;
  void *dictBuffer;
  U32 *freqs;
  size_t sVar2;
  size_t sVar3;
  COVER_dictSelection_t ds;
  ZDICT_cover_params_t parameters;
  size_t in_stack_ffffffffffffff58;
  COVER_dictSelection_t local_98;
  U16 *local_78;
  size_t local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ctx = *opaque;
  local_68 = *(undefined8 *)((long)opaque + 0x18);
  uStack_60 = *(undefined8 *)((long)opaque + 0x20);
  local_58 = *(undefined8 *)((long)opaque + 0x28);
  uStack_50 = *(undefined8 *)((long)opaque + 0x30);
  local_48 = *(undefined8 *)((long)opaque + 0x38);
  uStack_40 = *(undefined8 *)((long)opaque + 0x40);
  sVar3 = *(size_t *)((long)opaque + 0x10);
  bVar1 = (byte)ctx->f;
  __ptr = (U16 *)calloc(1L << (bVar1 & 0x3f),2);
  local_70 = sVar3;
  dictBuffer = malloc(sVar3);
  local_98.dictContent = (BYTE *)0x0;
  local_98.dictSize = 0;
  local_98.totalCompressedSize = 0xffffffffffffffff;
  sVar3 = 4L << (bVar1 & 0x3f);
  freqs = (U32 *)malloc(sVar3);
  if ((dictBuffer == (void *)0x0 || __ptr == (U16 *)0x0) || freqs == (U32 *)0x0) {
    if (g_displayLevel < 1) goto LAB_0018f5d6;
    FASTCOVER_tryParameters_cold_1();
  }
  else {
    local_78 = __ptr;
    memcpy(freqs,ctx->freqs,sVar3);
    sVar3 = local_70;
    __ptr = local_78;
    sVar2 = FASTCOVER_buildDictionary
                      (ctx,freqs,dictBuffer,local_70,*(ZDICT_cover_params_t *)((long)opaque + 0x18),
                       local_78);
    params.steps = (undefined4)uStack_60;
    params.nbThreads = uStack_60._4_4_;
    params.k = (undefined4)local_68;
    params.d = local_68._4_4_;
    params.splitPoint = (double)local_58;
    params.shrinkDict = (undefined4)uStack_50;
    params.shrinkDictMaxRegression = uStack_50._4_4_;
    params.zParams.compressionLevel = (undefined4)local_48;
    params.zParams.notificationLevel = local_48._4_4_;
    params._40_8_ = uStack_40;
    COVER_selectDict(&local_98,(BYTE *)((long)dictBuffer + sVar2),sVar3,sVar3 - sVar2,ctx->samples,
                     ctx->samplesSizes,
                     (uint)(((ulong)(ctx->accelParams).finalize * ctx->nbTrainSamples) / 100),
                     ctx->nbTrainSamples,ctx->nbSamples,params,ctx->offsets,
                     in_stack_ffffffffffffff58);
    if ((local_98.dictContent != (BYTE *)0x0 && local_98.totalCompressedSize < 0xffffffffffffff89)
       || (g_displayLevel < 1)) goto LAB_0018f5d6;
    FASTCOVER_tryParameters_cold_2();
  }
  fflush(_stderr);
LAB_0018f5d6:
  free(dictBuffer);
  parameters_00.steps = (undefined4)uStack_60;
  parameters_00.nbThreads = uStack_60._4_4_;
  parameters_00.k = (undefined4)local_68;
  parameters_00.d = local_68._4_4_;
  parameters_00.splitPoint = (double)local_58;
  parameters_00.shrinkDict = (undefined4)uStack_50;
  parameters_00.shrinkDictMaxRegression = uStack_50._4_4_;
  parameters_00.zParams.compressionLevel = (undefined4)local_48;
  parameters_00.zParams.notificationLevel = local_48._4_4_;
  parameters_00._40_8_ = uStack_40;
  selection.dictSize = local_98.dictSize;
  selection.dictContent = local_98.dictContent;
  selection.totalCompressedSize = local_98.totalCompressedSize;
  COVER_best_finish(*(COVER_best_t **)((long)opaque + 8),parameters_00,selection);
  free(opaque);
  free(__ptr);
  free(local_98.dictContent);
  free(freqs);
  return;
}

Assistant:

static void FASTCOVER_tryParameters(void* opaque)
{
  /* Save parameters as local variables */
  FASTCOVER_tryParameters_data_t *const data = (FASTCOVER_tryParameters_data_t*)opaque;
  const FASTCOVER_ctx_t *const ctx = data->ctx;
  const ZDICT_cover_params_t parameters = data->parameters;
  size_t dictBufferCapacity = data->dictBufferCapacity;
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Initialize array to keep track of frequency of dmer within activeSegment */
  U16* segmentFreqs = (U16*)calloc(((U64)1 << ctx->f), sizeof(U16));
  /* Allocate space for hash table, dict, and freqs */
  BYTE *const dict = (BYTE*)malloc(dictBufferCapacity);
  COVER_dictSelection_t selection = COVER_dictSelectionError(ERROR(GENERIC));
  U32* freqs = (U32*) malloc(((U64)1 << ctx->f) * sizeof(U32));
  if (!segmentFreqs || !dict || !freqs) {
    DISPLAYLEVEL(1, "Failed to allocate buffers: out of memory\n");
    goto _cleanup;
  }
  /* Copy the frequencies because we need to modify them */
  memcpy(freqs, ctx->freqs, ((U64)1 << ctx->f) * sizeof(U32));
  /* Build the dictionary */
  { const size_t tail = FASTCOVER_buildDictionary(ctx, freqs, dict, dictBufferCapacity,
                                                    parameters, segmentFreqs);

    const unsigned nbFinalizeSamples = (unsigned)(ctx->nbTrainSamples * ctx->accelParams.finalize / 100);
    selection = COVER_selectDict(dict + tail, dictBufferCapacity, dictBufferCapacity - tail,
         ctx->samples, ctx->samplesSizes, nbFinalizeSamples, ctx->nbTrainSamples, ctx->nbSamples, parameters, ctx->offsets,
         totalCompressedSize);

    if (COVER_dictSelectionIsError(selection)) {
      DISPLAYLEVEL(1, "Failed to select dictionary\n");
      goto _cleanup;
    }
  }
_cleanup:
  free(dict);
  COVER_best_finish(data->best, parameters, selection);
  free(data);
  free(segmentFreqs);
  COVER_dictSelectionFree(selection);
  free(freqs);
}